

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swin_transformer.h
# Opt level: O0

void __thiscall
shift_window_transformer::SwinTransformer<float>::forward
          (SwinTransformer<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  int iVar1;
  initializer_list<int> __l;
  reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  float local_178;
  int local_174;
  float local_170;
  int j;
  float sum;
  int i;
  int batch;
  undefined8 local_158;
  undefined1 local_150 [8];
  Tensor<float> tmp6;
  Tensor<float> tmp5;
  Tensor<float> tmp4;
  Tensor<float> tmp3;
  undefined1 local_80 [8];
  Tensor<float> tmp2;
  Tensor<float> tmp1;
  Tensor<float> *output_local;
  Tensor<float> *input_local;
  SwinTransformer<float> *this_local;
  
  Tensor<float>::Tensor
            ((Tensor<float> *)
             &tmp2.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::Tensor((Tensor<float> *)local_80);
  Tensor<float>::Tensor
            ((Tensor<float> *)
             &tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::Tensor
            ((Tensor<float> *)
             &tmp5.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::Tensor
            ((Tensor<float> *)
             &tmp6.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::Tensor((Tensor<float> *)local_150);
  StageModule<float>::forward
            (&this->stage1,input,
             (Tensor<float> *)
             &tmp2.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  StageModule<float>::forward
            (&this->stage2,
             (Tensor<float> *)
             &tmp2.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Tensor<float> *)local_80);
  StageModule<float>::forward
            (&this->stage3,(Tensor<float> *)local_80,
             (Tensor<float> *)
             &tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  StageModule<float>::forward
            (&this->stage4,
             (Tensor<float> *)
             &tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Tensor<float> *)
             &tmp5.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &tmp4.super_vector<float,_std::allocator<float>_>.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,0);
  i = *pvVar2;
  _batch = &i;
  local_158 = 1;
  __l._M_len = 1;
  __l._M_array = _batch;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             &tmp5.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__l);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &tmp4.super_vector<float,_std::allocator<float>_>.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,1);
  iVar1 = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &tmp4.super_vector<float,_std::allocator<float>_>.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,2);
  sum = (float)(iVar1 * *pvVar2);
  j = 0;
  while( true ) {
    uVar3 = (ulong)j;
    sVar4 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)
                       &tmp5.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (sVar4 <= uVar3) break;
    local_170 = 0.0;
    for (local_174 = 0; local_174 < (int)sum; local_174 = local_174 + 1) {
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &tmp5.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)(j + local_174));
      local_170 = *pvVar5 + local_170;
    }
    local_178 = local_170 / (float)(int)sum;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)
               &tmp6.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_178);
    j = (int)sum + j;
  }
  LayerNorm<float>::forward
            (&this->layerNorm,
             (Tensor<float> *)
             &tmp6.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Tensor<float> *)local_150);
  Linear<float>::forward(&this->linear,(Tensor<float> *)local_150,output);
  Tensor<float>::~Tensor((Tensor<float> *)local_150);
  Tensor<float>::~Tensor
            ((Tensor<float> *)
             &tmp6.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::~Tensor
            ((Tensor<float> *)
             &tmp5.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::~Tensor
            ((Tensor<float> *)
             &tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::~Tensor((Tensor<float> *)local_80);
  Tensor<float>::~Tensor
            ((Tensor<float> *)
             &tmp2.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void forward(const Tensor<T> &input, Tensor<T> &output) {
            Tensor<T> tmp1{};
            Tensor<T> tmp2{};
            Tensor<T> tmp3{};
            Tensor<T> tmp4{};
            Tensor<T> tmp5{};
            Tensor<T> tmp6{};
            stage1.forward(input, tmp1);
            stage2.forward(tmp1, tmp2);
            stage3.forward(tmp2, tmp3);
            stage4.forward(tmp3, tmp4);
            tmp5.shape = {tmp4.shape[0]};
            int batch = tmp4.shape[1] * tmp4.shape[2];
            for (int i = 0; i < tmp4.size(); i += batch) {
                T sum = 0;
                for (int j = 0; j < batch; ++j) {
                    sum += tmp4[i + j];
                }
                tmp5.push_back(sum / batch);
            }
            layerNorm.forward(tmp5, tmp6);
            linear.forward(tmp6, output);
        }